

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O3

void Rtm_ObjRetimeFwd(Rtm_Man_t *pRtm,Rtm_Obj_t *pObj)

{
  Rtm_Edg_t *pRVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  
  uVar3 = *(uint *)&pObj->field_0x8 >> 7 & 0xff;
  if (uVar3 != 0) {
    uVar7 = 0;
    do {
      if ((*(ushort *)(&pObj[1].field_0x8 + uVar7) & 0xfff) == 0) {
        __assert_fail("Rtm_ObjCheckRetimeFwd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                      ,0x208,"void Rtm_ObjRetimeFwd(Rtm_Man_t *, Rtm_Obj_t *)");
      }
      uVar7 = uVar7 + 0x10;
    } while (uVar3 << 4 != uVar7);
  }
  if ((*(uint *)&pObj->field_0x8 & 0x7f80) == 0) {
    iVar9 = 2;
  }
  else {
    iVar9 = 2;
    uVar7 = 0;
    do {
      pRVar1 = (Rtm_Edg_t *)(&pObj[1].field_0x8 + uVar7 * 0x10);
      uVar3 = *(uint *)(&pObj[1].field_0x8 + uVar7 * 0x10);
      uVar6 = uVar3 & 0xfff;
      if (uVar6 < 0xb) {
        uVar4 = uVar3 >> 2 & 0x3ffff000;
        *(uint *)pRVar1 = uVar4 + uVar6;
        if (uVar6 == 0) {
          __assert_fail("pEdge->nLats > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                        ,0x5e,"Rtm_Init_t Rtm_ObjRemFirst1(Rtm_Edg_t *)");
        }
        uVar6 = uVar3 >> 0xc & 3;
        uVar3 = uVar3 - 1 & 0xfff;
        *(uint *)pRVar1 = uVar4 | uVar3;
      }
      else {
        puVar5 = pRtm->pExtra + (uVar3 >> 0xc);
        *(uint *)pRVar1 = uVar3 & 0xfffff000 | uVar3 - 1 & 0xfff;
        puVar2 = puVar5 + ((ulong)(((uVar3 >> 4 & 0xff) + 1) - (uint)((uVar3 & 0xf) == 0)) - 1);
        if (puVar2 < puVar5) {
LAB_006ce1d0:
          __assert_fail("Val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                        ,0xed,"Rtm_Init_t Rtm_ObjRemFirst2(Rtm_Man_t *, Rtm_Edg_t *)");
        }
        uVar6 = 0;
        do {
          uVar3 = *puVar2;
          *puVar2 = uVar6 << 0x1e | uVar3 >> 2;
          uVar6 = uVar3 & 3;
          puVar2 = puVar2 + -1;
        } while (puVar5 <= puVar2);
        if (uVar6 == 0) goto LAB_006ce1d0;
        uVar3 = *(uint *)pRVar1 & 0xfff;
      }
      if (uVar3 == 10) {
        Rtm_ObjTransferToSmall(pRtm,pRVar1);
      }
      uVar3 = uVar6;
      if (((*(uint *)&pObj->field_0x8 & (uint)(uVar7 != 0) * 0x20 + 0x20) == 0) ||
         (uVar3 = 2, uVar6 == 1)) {
        if (((iVar9 != 2) || (iVar8 = 2, uVar3 != 2)) && ((iVar8 = 1, iVar9 != 1 && (uVar3 != 1))))
        {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                        ,0x54,"Rtm_Init_t Rtm_InitAnd(Rtm_Init_t, Rtm_Init_t)");
        }
      }
      else {
        iVar8 = 1;
        if (uVar6 != 2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                        ,0x52,"Rtm_Init_t Rtm_InitNot(Rtm_Init_t)");
        }
      }
      iVar9 = iVar8;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (*(uint *)&pObj->field_0x8 >> 7 & 0xff));
  }
  if (0 < pObj->nFanouts) {
    iVar8 = 0;
    do {
      pRVar1 = *(Rtm_Edg_t **)
                (&pObj[1].field_0x8 +
                (ulong)(((*(uint *)&pObj->field_0x8 >> 7 & 0xff) + iVar8) * 2) * 8);
      if ((*(uint *)pRVar1 & 0xfff) == 10) {
        Rtm_ObjTransferToBig(pRtm,pRVar1);
      }
      else if ((~*(uint *)pRVar1 & 0xf) == 0) {
        Rtm_ObjTransferToBigger(pRtm,pRVar1);
      }
      uVar3 = *(uint *)pRVar1;
      if ((uVar3 & 0xffe) < 10) {
        uVar3 = uVar3 + 1 & 0xfff | uVar3 & 0xfffff000 |
                (iVar9 << ((char)uVar3 * '\x02' & 0x1fU)) << 0xc;
      }
      else {
        puVar2 = (uint *)((long)pRtm->pExtra +
                         (ulong)(uVar3 >> 2 & 0x3fc) + (ulong)(uVar3 >> 0xc) * 4);
        *puVar2 = *puVar2 | iVar9 << ((char)uVar3 * '\x02' & 0x1fU);
        uVar3 = *(uint *)pRVar1 & 0xfffff000 | *(uint *)pRVar1 + 1 & 0xfff;
      }
      *(uint *)pRVar1 = uVar3;
      iVar8 = iVar8 + 1;
    } while (iVar8 < pObj->nFanouts);
  }
  return;
}

Assistant:

void Rtm_ObjRetimeFwd( Rtm_Man_t * pRtm, Rtm_Obj_t * pObj )
{
    Rtm_Init_t ValTotal, ValCur;
    Rtm_Edg_t * pEdge;
    int i;
    assert( Rtm_ObjCheckRetimeFwd(pObj) );
    // extract values and compute the result
    ValTotal = RTM_VAL_ONE;
    Rtm_ObjForEachFaninEdge( pObj, pEdge, i )
    {
        ValCur = Rtm_ObjRemFirst( pRtm, pEdge );
        ValCur = Rtm_InitNotCond( ValCur, i? pObj->fCompl1 : pObj->fCompl0 );
        ValTotal = Rtm_InitAnd( ValTotal, ValCur );
    }
    // insert the result in the fanout values
    Rtm_ObjForEachFanoutEdge( pObj, pEdge, i )
        Rtm_ObjAddLast( pRtm, pEdge, ValTotal );
}